

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-util-ossl.cpp
# Opt level: O1

int crypto_import_certificate
              (CK_SESSION_HANDLE hSession,char *filePath,char *label,char *objID,size_t objIDLen)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  BIO *bp;
  X509 *a;
  X509_NAME *pXVar6;
  ASN1_INTEGER *pAVar7;
  uchar *puVar8;
  uchar *__ptr;
  uchar *__ptr_00;
  ulong uVar9;
  CK_RV CVar10;
  uchar *__ptr_01;
  char *__format;
  CK_BBOOL ckFalse;
  CK_BBOOL ckTrue;
  CK_BYTE_PTR p;
  CK_OBJECT_HANDLE hCert;
  CK_CERTIFICATE_TYPE certType;
  CK_OBJECT_CLASS certClass;
  CK_ATTRIBUTE certTemplate [10];
  undefined1 local_1a1;
  ulong local_1a0;
  uint local_198;
  undefined1 local_191;
  uchar *local_190;
  BIO *local_188;
  uchar *local_180;
  uchar *local_178;
  X509 *local_170;
  ulong local_168;
  char *local_160;
  size_t local_158;
  CK_SESSION_HANDLE local_150;
  char *local_148;
  CK_OBJECT_HANDLE local_140;
  undefined8 local_138;
  undefined8 local_130;
  _CK_ATTRIBUTE local_128;
  undefined8 local_110;
  long local_108;
  undefined8 local_100;
  undefined8 local_f8;
  char *local_f0;
  size_t local_e8;
  undefined8 local_e0;
  char *local_d8;
  size_t local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  uchar *local_90;
  ulong local_88;
  undefined8 local_80;
  uchar *local_78;
  ulong local_70;
  undefined8 local_68;
  uchar *local_60;
  ulong local_58;
  undefined8 local_50;
  uchar *local_48;
  ulong local_40;
  undefined4 extraout_var;
  
  bp = BIO_new_file(filePath,"rb");
  if (bp == (BIO *)0x0) {
    __format = "ERROR: Could open the PKCS#8 file: %s\n";
LAB_001165d7:
    a = (X509 *)0x0;
    fprintf(_stderr,__format,filePath);
  }
  else {
    local_148 = label;
    a = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if (a == (X509 *)0x0) {
      __format = "ERROR: Could not read the certificate file: %s\n";
      goto LAB_001165d7;
    }
    local_160 = objID;
    local_158 = objIDLen;
    local_150 = hSession;
    uVar1 = i2d_X509(a,(uchar **)0x0);
    pXVar6 = X509_get_subject_name(a);
    uVar2 = i2d_X509_NAME(pXVar6,(uchar **)0x0);
    pXVar6 = X509_get_issuer_name(a);
    uVar3 = i2d_X509_NAME(pXVar6,(uchar **)0x0);
    pAVar7 = X509_get_serialNumber(a);
    uVar4 = i2d_ASN1_INTEGER(pAVar7,(uchar **)0x0);
    if ((((-1 < (int)uVar1) && (-1 < (int)uVar2)) && (-1 < (int)uVar3)) && (-1 < (int)uVar4)) {
      if ((int)uVar1 < 1) {
        local_190 = (uchar *)0x0;
        local_1a0 = local_1a0 & 0xffffffff00000000;
      }
      else {
        puVar8 = (uchar *)malloc((ulong)uVar1);
        if (puVar8 == (uchar *)0x0) {
          crypto_import_certificate();
          goto LAB_00116650;
        }
        local_190 = puVar8;
        local_178 = puVar8;
        iVar5 = i2d_X509(a,&local_178);
        local_1a0 = CONCAT44(local_1a0._4_4_,iVar5);
      }
      local_188 = bp;
      if ((int)uVar2 < 1) {
        puVar8 = (uchar *)0x0;
        uVar1 = 0;
LAB_00116360:
        if ((int)uVar3 < 1) {
          __ptr = (uchar *)0x0;
          local_198 = 0;
        }
        else {
          __ptr = (uchar *)malloc((ulong)uVar3);
          if (__ptr == (uchar *)0x0) {
            crypto_import_certificate();
            __ptr = (uchar *)0x0;
            bp = local_188;
            goto LAB_001166a9;
          }
          local_178 = __ptr;
          pXVar6 = X509_get_issuer_name(a);
          local_198 = i2d_X509_NAME(pXVar6,&local_178);
        }
        uVar9 = 0;
        local_180 = puVar8;
        if ((int)uVar4 < 1) {
          __ptr_00 = (uchar *)0x0;
        }
        else {
          __ptr_00 = (uchar *)malloc((ulong)uVar4);
          if (__ptr_00 == (uchar *)0x0) {
            crypto_import_certificate();
            bp = local_188;
            goto LAB_001166a9;
          }
          local_178 = __ptr_00;
          pAVar7 = X509_get_serialNumber(a);
          iVar5 = i2d_ASN1_INTEGER(pAVar7,&local_178);
          uVar9 = CONCAT44(extraout_var,iVar5);
        }
        if ((((int)local_1a0 < 0) || ((int)uVar1 < 0)) || (((int)local_198 < 0 || ((int)uVar9 < 0)))
           ) {
          crypto_import_certificate();
          local_1a0 = 1;
          __ptr_01 = local_190;
          puVar8 = local_180;
          bp = local_188;
        }
        else {
          local_128.pValue = &local_130;
          local_130 = 1;
          local_108 = (long)&local_138;
          local_138 = 0;
          local_1a1 = 0;
          local_191 = 1;
          local_128.type = 0;
          local_128.ulValueLen = 8;
          local_110 = 0x80;
          local_100 = 8;
          local_f8 = 3;
          local_f0 = local_148;
          local_170 = a;
          local_168 = uVar9;
          local_e8 = strlen(local_148);
          __ptr_01 = local_190;
          local_e0 = 0x102;
          local_d8 = local_160;
          local_d0 = local_158;
          local_c8 = 1;
          local_b8 = 1;
          local_b0 = 2;
          local_a8 = &local_1a1;
          local_a0 = 1;
          local_98 = 0x11;
          local_90 = local_190;
          local_88 = local_1a0 & 0xffffffff;
          local_80 = 0x101;
          local_78 = local_180;
          local_70 = (ulong)uVar1;
          local_68 = 0x81;
          local_58 = (ulong)local_198;
          local_50 = 0x82;
          local_40 = local_168 & 0xffffffff;
          local_c0 = &local_191;
          local_60 = __ptr;
          local_48 = __ptr_00;
          CVar10 = (*p11->C_CreateObject)(local_150,&local_128,10,&local_140);
          if (CVar10 == 0) {
            puts("The certificate has been imported.");
            local_1a0 = 0;
            puVar8 = local_180;
            bp = local_188;
            a = local_170;
          }
          else {
            fwrite("ERROR: Could not save the certificate in the token.\n",0x34,1,_stderr);
            local_1a0 = 1;
            puVar8 = local_180;
            bp = local_188;
            a = local_170;
          }
        }
      }
      else {
        puVar8 = (uchar *)malloc((ulong)uVar2);
        if (puVar8 != (uchar *)0x0) {
          local_178 = puVar8;
          pXVar6 = X509_get_subject_name(a);
          uVar1 = i2d_X509_NAME(pXVar6,&local_178);
          goto LAB_00116360;
        }
        crypto_import_certificate();
        puVar8 = (uchar *)0x0;
        __ptr = (uchar *)0x0;
LAB_001166a9:
        local_1a0 = 1;
        __ptr_00 = (uchar *)0x0;
        __ptr_01 = local_190;
      }
      goto LAB_001166ae;
    }
    crypto_import_certificate();
  }
LAB_00116650:
  local_1a0 = 1;
  __ptr_01 = (uchar *)0x0;
  puVar8 = (uchar *)0x0;
  __ptr = (uchar *)0x0;
  __ptr_00 = (uchar *)0x0;
LAB_001166ae:
  free(__ptr_01);
  free(puVar8);
  free(__ptr);
  free(__ptr_00);
  X509_free(a);
  BIO_free(bp);
  return (int)local_1a0;
}

Assistant:

int crypto_import_certificate
(
	CK_SESSION_HANDLE hSession,
	char* filePath,
	char* label,
	char* objID,
	size_t objIDLen
)
{
	BIO* in = NULL;
	X509* x509 = NULL;
	CK_BYTE_PTR blob = NULL;
	CK_BYTE_PTR subject = NULL;
	CK_BYTE_PTR issuer = NULL;
	CK_BYTE_PTR serial = NULL;
	CK_BYTE_PTR p;
	int blobSize;
	int subjectSize;
	int issuerSize;
	int serialSize;
	int ret = 1;

	if (!(in = BIO_new_file(filePath, "rb")))
	{
		fprintf(stderr, "ERROR: Could open the PKCS#8 file: %s\n", filePath);
		goto cleanup;
	}

	if ((x509 = PEM_read_bio_X509(in, NULL, NULL, NULL)) == NULL)
	{
		fprintf(stderr, "ERROR: Could not read the certificate file: %s\n", filePath);
		goto cleanup;
	}

	blobSize = i2d_X509(x509, NULL);
	subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), NULL);
	issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), NULL);
	serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), NULL);

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	if (blobSize > 0)
	{
		if ((blob = (CK_BYTE_PTR)malloc(blobSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = blob;
		blobSize = i2d_X509(x509, &p);
	}
	if (subjectSize > 0) {
		if ((subject = (CK_BYTE_PTR)malloc(subjectSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = subject;
		subjectSize = i2d_X509_NAME(X509_get_subject_name(x509), &p);
	}
	if (issuerSize > 0)
	{
		if ((issuer = (CK_BYTE_PTR)malloc(issuerSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = issuer;
		issuerSize = i2d_X509_NAME(X509_get_issuer_name(x509), &p);
	}
	if (serialSize > 0)
	{
		if ((serial = (CK_BYTE_PTR)malloc(serialSize)) == NULL)
		{
			fprintf(stderr, "ERROR: Could not allocate memory.\n");
			goto cleanup;
		}
		p = serial;
		serialSize = i2d_ASN1_INTEGER(X509_get_serialNumber(x509), &p);
	}

	if
	(
		blobSize < 0 ||
		subjectSize < 0 ||
		issuerSize < 0 ||
		serialSize < 0
	)
	{
		fprintf(stderr, "ERROR: Could not convert certificate to DER.\n");
		goto cleanup;
	}

	{
		CK_OBJECT_CLASS certClass = CKO_CERTIFICATE;
		CK_CERTIFICATE_TYPE certType = CKC_X_509;
		CK_BBOOL ckFalse = CK_FALSE, ckTrue = CK_TRUE;
		CK_ATTRIBUTE certTemplate[] = {
			{ CKA_CLASS,            &certClass,   sizeof(certClass) },
			{ CKA_CERTIFICATE_TYPE, &certType,    sizeof(certType) },
			{ CKA_LABEL,            label,        strlen(label) },
			{ CKA_ID,               objID,        objIDLen },
			{ CKA_TOKEN,            &ckTrue,      sizeof(ckTrue) },
			{ CKA_PRIVATE,          &ckFalse,     sizeof(ckFalse) },
			{ CKA_VALUE,            blob,         (CK_ULONG)blobSize },
			{ CKA_SUBJECT,          subject,      (CK_ULONG)subjectSize },
			{ CKA_ISSUER,           issuer,       (CK_ULONG)issuerSize },
			{ CKA_SERIAL_NUMBER,    serial,       (CK_ULONG)serialSize }
		};

		CK_OBJECT_HANDLE hCert;
		CK_RV rv = p11->C_CreateObject(hSession, certTemplate, 10, &hCert);
		if (rv != CKR_OK)
		{
			fprintf(stderr, "ERROR: Could not save the certificate in the token.\n");
			goto cleanup;
		}
	}

	printf("The certificate has been imported.\n");

	ret = 0;

cleanup:

	free(blob);
	free(subject);
	free(issuer);
	free(serial);
	X509_free(x509);
	BIO_free(in);

	return ret;
}